

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cpp
# Opt level: O2

int __thiscall avilib::AviReader::open(AviReader *this,char *__file,int __oflag,...)

{
  AVISTREAMHEADER *pAVar1;
  WORD WVar2;
  uint uVar3;
  _Elt_pointer puVar4;
  double dVar5;
  char cVar6;
  char cVar7;
  int iVar8;
  undefined8 uVar9;
  long *plVar10;
  long lVar11;
  void *pvVar12;
  int *piVar13;
  uint *puVar14;
  mapped_type *pmVar15;
  mapped_type *pmVar16;
  char *pcVar17;
  ulong uVar18;
  char cVar19;
  uint32_t i;
  uint uVar20;
  ifstream *piVar21;
  LoggingObject *this_00;
  undefined8 *puVar22;
  _Ios_Seekdir _Var23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  AVIOLDINDEX *idx;
  size_t i_1;
  undefined8 *puVar27;
  uint32_t size;
  char tag [5];
  allocator local_419;
  ifstream *local_418;
  LoggingObject *local_410;
  int *local_408;
  undefined8 local_400;
  ulong local_3f8;
  uint local_3f0;
  int32_t stream_idx;
  AVISUPERINDEX super_index;
  AVISUPERINDEX_ENTRY entry;
  FOURCC local_3b8;
  undefined4 uStack_3b4;
  undefined4 uStack_3b0;
  undefined4 uStack_3ac;
  ulong local_3a0;
  VIDEO_PROP_HEADER vprop_header;
  undefined4 uStack_374;
  ulong local_370;
  undefined8 *local_368;
  DMLINDEX dml_index;
  string fcc;
  array<unsigned_int,_6UL> allowed;
  uint local_240 [2];
  char message [512];
  
  tag[0] = '\0';
  tag[1] = '\0';
  tag[2] = '\0';
  tag[3] = '\0';
  size = 0;
  tag[4] = '\0';
  this->m_useMovieOffset = false;
  this_00 = &this->super_LoggingObject;
  LoggingObject::clear_log(this_00);
  std::deque<unsigned_long,_std::allocator<unsigned_long>_>::clear(&this->m_moviOffs);
  piVar21 = &this->_f;
  std::ifstream::open((char *)piVar21,(_Ios_Openmode)__file);
  if (*(int *)(&this->field_0x78 + *(long *)(*(long *)&this->_f + -0x18)) != 0) {
    dVar5 = (double)std::__cxx11::string::string
                              ((string *)&vprop_header,"Cannot parse, file is bad.",
                               (allocator *)&super_index);
    LoggingObject::log(this_00,dVar5);
    std::__cxx11::string::~string((string *)&vprop_header);
    return 0;
  }
  std::istream::seekg((long)piVar21,_S_beg);
  local_3f0 = 0;
  local_400 = (ulong)local_400._4_4_ << 0x20;
  local_418 = piVar21;
  local_410 = this_00;
LAB_00131454:
  do {
    pcVar17 = tag;
    if (*(int *)(&this->field_0x78 + *(long *)(*(long *)&this->_f + -0x18)) != 0) {
LAB_00132449:
      if ((this->odml_frameIdxs)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
        std::
        _Rb_tree<int,_std::pair<const_int,_std::deque<avilib::AviReader::_dmlindex,_std::allocator<avilib::AviReader::_dmlindex>_>_>,_std::_Select1st<std::pair<const_int,_std::deque<avilib::AviReader::_dmlindex,_std::allocator<avilib::AviReader::_dmlindex>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::deque<avilib::AviReader::_dmlindex,_std::allocator<avilib::AviReader::_dmlindex>_>_>_>_>
        ::swap(&(this->m_frameIdxs)._M_t,&(this->odml_frameIdxs)._M_t);
        dVar5 = (double)std::__cxx11::string::string
                                  ((string *)&vprop_header,"using OpenDML index",
                                   (allocator *)&super_index);
        LoggingObject::log(this_00,dVar5);
        std::__cxx11::string::~string((string *)&vprop_header);
      }
      std::ios::clear((int)*(undefined8 *)(*(long *)&this->_f + -0x18) + (int)piVar21);
      std::istream::seekg((long)piVar21,_S_beg);
      puVar4 = (this->m_moviOffs).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Deque_impl_data._M_finish._M_cur;
      return (int)CONCAT71((int7)((ulong)puVar4 >> 8),
                           puVar4 != (this->m_moviOffs).
                                     super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Deque_impl_data._M_start._M_cur);
    }
    uVar9 = std::istream::tellg();
    plVar10 = (long *)std::istream::read((char *)piVar21,(long)pcVar17);
    if ((*(byte *)((long)plVar10 + *(long *)(*plVar10 + -0x18) + 0x20) & 5) != 0) goto LAB_00132449;
    snprintf(message,0x200,"%s @ %llu",pcVar17,uVar9);
    dVar5 = (double)std::__cxx11::string::string
                              ((string *)&vprop_header,message,(allocator *)&super_index);
    LoggingObject::log(this_00,dVar5);
    std::__cxx11::string::~string((string *)&vprop_header);
    uVar20 = local_3f0;
  } while (tag._0_4_ == 0x20495641);
  if (tag._0_4_ == 0x31786469) {
    std::istream::read((char *)piVar21,(long)&size);
    piVar13 = (int *)operator_new__((ulong)size);
    lVar11 = std::istream::read((char *)piVar21,(long)piVar13);
    uVar20 = *(uint *)(lVar11 + 8);
    size = uVar20;
    local_408 = piVar13;
    for (uVar18 = 0; uVar18 < uVar20 >> 4; uVar18 = uVar18 + 1) {
      if (*piVar13 != 0x20636572) {
        fcc._M_dataplus._M_p._4_4_ = piVar13[1];
        fcc._M_string_length = (size_type)(uint)piVar13[2];
        fcc.field_2._M_allocated_capacity._0_4_ = piVar13[3];
        fcc._M_dataplus._M_p._0_4_ = *piVar13;
        std::__cxx11::string::string
                  ((string *)&vprop_header,(char *)piVar13,(allocator *)&super_index);
        std::__cxx11::string::substr((ulong)&super_index,(ulong)&vprop_header);
        iVar8 = atoi((char *)CONCAT44(super_index.cb,super_index.fcc._));
        std::__cxx11::string::~string((string *)&super_index);
        entry.qwOffset = CONCAT44(entry.qwOffset._4_4_,iVar8);
        pmVar15 = std::
                  map<int,_std::deque<avilib::AviReader::_dmlindex,_std::allocator<avilib::AviReader::_dmlindex>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::deque<avilib::AviReader::_dmlindex,_std::allocator<avilib::AviReader::_dmlindex>_>_>_>_>
                  ::operator[](&this->m_frameIdxs,(key_type_conflict *)&entry);
        std::deque<avilib::AviReader::_dmlindex,_std::allocator<avilib::AviReader::_dmlindex>_>::
        push_back(pmVar15,(value_type *)&fcc);
        std::__cxx11::string::~string((string *)&vprop_header);
        uVar20 = size;
      }
      piVar13 = piVar13 + 4;
    }
    snprintf(message,0x200,"%x AVIOLDINDEX");
    dVar5 = (double)std::__cxx11::string::string
                              ((string *)&vprop_header,message,(allocator *)&super_index);
    piVar21 = local_418;
    LoggingObject::log(this_00,dVar5);
    std::__cxx11::string::~string((string *)&vprop_header);
    operator_delete__(local_408);
    goto LAB_00131454;
  }
  if (tag._0_4_ != 0x46464952) {
    if (tag._0_4_ == 0x78646e69) {
      std::istream::read((char *)piVar21,(long)&size);
      lVar11 = std::istream::tellg();
      uVar18 = (ulong)size;
      super_index.fcc = (FOURCC)tag._0_4_;
      super_index.cb = size;
      std::istream::read((char *)piVar21,(long)&super_index.wLongsPerEntry);
      std::__cxx11::string::string
                ((string *)&fcc,super_index.dwChunkId.fcc,(allocator *)&vprop_header);
      local_408 = (int *)lVar11;
      std::__cxx11::string::substr((ulong)&vprop_header,(ulong)&fcc);
      iVar8 = atoi((char *)vprop_header._0_8_);
      std::__cxx11::string::~string((string *)&vprop_header);
      stream_idx = iVar8;
      if (super_index.bIndexSubType != '\0') {
        __assert_fail("0 == super_index.bIndexSubType",
                      "/workspace/llm4binary/github/license_c_cmakelists/arionik[P]avilib/reader.cpp"
                      ,0x10a,"bool avilib::AviReader::open(const char *)");
      }
      if (super_index.bIndexType != '\0') {
        dVar5 = (double)std::__cxx11::string::string
                                  ((string *)&vprop_header,
                                   "Warning: AVI_INDEX_OF_INDEXES != super_index.bIndexType",
                                   (allocator *)&entry);
        LoggingObject::log(this_00,dVar5);
        std::__cxx11::string::~string((string *)&vprop_header);
      }
      std::_Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
      ::_Deque_base((_Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                     *)&vprop_header);
      local_408 = (int *)((long)local_408 + uVar18);
      for (uVar20 = 0; uVar20 < super_index.nEntriesInUse; uVar20 = uVar20 + 1) {
        std::istream::read((char *)local_418,(long)&entry);
        std::deque<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>::
        push_back((deque<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                   *)&vprop_header,&entry);
      }
      snprintf(message,0x200,"%ux AVISUPERINDEX_ENTRY (%s)",(ulong)super_index.nEntriesInUse,
               CONCAT44(fcc._M_dataplus._M_p._4_4_,(int)fcc._M_dataplus._M_p));
      dVar5 = (double)std::__cxx11::string::string((string *)&entry,message,(allocator *)&dml_index)
      ;
      LoggingObject::log(this_00,dVar5);
      piVar21 = local_418;
      std::__cxx11::string::~string((string *)&entry);
      puVar27 = (undefined8 *)CONCAT44(uStack_374,vprop_header.nbFieldPerFrame);
      local_3f8 = local_370;
      puVar22 = (undefined8 *)vprop_header._16_8_;
      while (puVar22 != local_368) {
        std::istream::seekg((long)piVar21,(_Ios_Seekdir)*puVar22);
        local_3b8._ = 0;
        uStack_3b4 = 0;
        uStack_3b0 = 0;
        uStack_3ac = 0;
        entry.qwOffset = 0;
        entry.dwSize = 0;
        entry.dwDuration = 0;
        std::istream::read((char *)piVar21,(long)&entry);
        if (local_3b8._ != 0x20636572) {
          allowed._M_elems[0] = 0x63643030;
          allowed._M_elems[1] = 0x62643030;
          allowed._M_elems[2] = 0x63643130;
          allowed._M_elems[3] = 0x62643130;
          allowed._M_elems[4] = 0x62773030;
          allowed._M_elems[5] = 0x62773130;
          puVar14 = std::
                    __find_if<unsigned_int*,__gnu_cxx::__ops::_Iter_equals_val<unsigned_int_const>>
                              (&allowed,local_240,&local_3b8);
          if (puVar14 != local_240) {
            if (entry.dwSize._3_1_ != '\x01') {
              dVar5 = (double)std::__cxx11::string::string
                                        ((string *)&dml_index,
                                         "Warning: AVI_INDEX_OF_CHUNKS != std_index.bIndexType",
                                         &local_419);
              LoggingObject::log(local_410,dVar5);
              std::__cxx11::string::~string((string *)&dml_index);
            }
            if (entry.dwSize._2_1_ != '\0') {
              dVar5 = (double)std::__cxx11::string::string
                                        ((string *)&dml_index,
                                         "Warning: 0 != std_index.bIndexSubType",&local_419);
              LoggingObject::log(local_410,dVar5);
              std::__cxx11::string::~string((string *)&dml_index);
            }
            pvVar12 = operator_new__(entry.qwOffset >> 0x20);
            std::istream::read((char *)local_418,(long)pvVar12);
            for (lVar11 = 0; (uint)lVar11 < entry.dwDuration; lVar11 = lVar11 + 1) {
              dml_index.dwChunkId = local_3b8;
              dml_index.u32_flags = 0;
              dml_index.i64_offset =
                   (ulong)*(uint *)((long)pvVar12 + lVar11 * 8) + CONCAT44(uStack_3b0,uStack_3b4);
              dml_index.u32_size = *(uint *)((long)pvVar12 + lVar11 * 8 + 4) & 0x7fffffff;
              pmVar15 = std::
                        map<int,_std::deque<avilib::AviReader::_dmlindex,_std::allocator<avilib::AviReader::_dmlindex>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::deque<avilib::AviReader::_dmlindex,_std::allocator<avilib::AviReader::_dmlindex>_>_>_>_>
                        ::operator[](&this->odml_frameIdxs,&stream_idx);
              std::
              deque<avilib::AviReader::_dmlindex,_std::allocator<avilib::AviReader::_dmlindex>_>::
              push_back(pmVar15,&dml_index);
            }
            operator_delete__(pvVar12);
            piVar21 = local_418;
          }
          std::ios::clear((int)*(undefined8 *)(*(long *)piVar21 + -0x18) + (int)piVar21);
        }
        puVar22 = puVar22 + 2;
        if (puVar22 == puVar27) {
          puVar22 = *(undefined8 **)(local_3f8 + 8);
          local_3f8 = local_3f8 + 8;
          puVar27 = puVar22 + 0x40;
        }
      }
      pmVar16 = std::
                map<int,_avilib::_avisuperindex_chunk,_std::less<int>,_std::allocator<std::pair<const_int,_avilib::_avisuperindex_chunk>_>_>
                ::operator[](&this->m_superIndex,&stream_idx);
      pmVar16->dwChunkId = super_index.dwChunkId;
      pmVar16->dwReserved[0] = super_index.dwReserved[0];
      *(undefined8 *)(pmVar16->dwReserved + 1) = super_index.dwReserved._4_8_;
      pmVar16->fcc = super_index.fcc;
      pmVar16->cb = super_index.cb;
      pmVar16->wLongsPerEntry = super_index.wLongsPerEntry;
      pmVar16->bIndexSubType = super_index.bIndexSubType;
      pmVar16->bIndexType = super_index.bIndexType;
      pmVar16->nEntriesInUse = super_index.nEntriesInUse;
      std::ios::clear((int)*(undefined8 *)(*(long *)piVar21 + -0x18) + (int)piVar21);
      std::istream::seekg((long)piVar21,(_Ios_Seekdir)local_408);
      std::_Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
      ::~_Deque_base((_Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                      *)&vprop_header);
      std::__cxx11::string::~string((string *)&fcc);
      this_00 = local_410;
      goto LAB_00131454;
    }
    if (tag._0_4_ == 0x4f464e49) goto LAB_00131454;
    if (tag._0_4_ == 0x54465349) goto LAB_00131d66;
    if (tag._0_4_ != 0x5453494c) {
      if (tag._0_4_ != 0x58495641) {
        if (tag._0_4_ == 0x66727473) {
          std::istream::read((char *)piVar21,(long)&size);
          if ((local_400 & 1) == 0) {
            std::istream::read((char *)piVar21,(long)&this->m_bitmapInfo);
            if (0x28 < size) {
              std::istream::seekg((long)piVar21,size - 0x28);
            }
            snprintf(message,0x200,
                     "BITMAPINFO (\n  biWidth=%i,\n  biHeight=%i,\n  biPlanes=%i,\n  biBitCount=%i,\n  biCompression=%s,\n  biSizeImage=%i,\n  biXPelsPerMeter=%i,\n  biYPelsPerMeter=%i,\n  biClrUsed=%i,\n  biClrImportant=%i,\n)"
                     ,(ulong)(uint)(this->m_bitmapInfo).biWidth,
                     (ulong)(uint)(this->m_bitmapInfo).biHeight,(ulong)(this->m_bitmapInfo).biPlanes
                     ,(ulong)(this->m_bitmapInfo).biBitCount,&(this->m_bitmapInfo).biCompression,
                     (ulong)(this->m_bitmapInfo).biSizeImage,
                     (ulong)(uint)(this->m_bitmapInfo).biXPelsPerMeter,
                     (ulong)(uint)(this->m_bitmapInfo).biYPelsPerMeter,
                     (ulong)(this->m_bitmapInfo).biClrUsed,
                     (ulong)(this->m_bitmapInfo).biClrImportant);
            dVar5 = (double)std::__cxx11::string::string
                                      ((string *)&vprop_header,message,(allocator *)&super_index);
            this_00 = local_410;
            LoggingObject::log(local_410,dVar5);
            std::__cxx11::string::~string((string *)&vprop_header);
            local_400 = local_400 & 0xffffffff00000000;
            piVar21 = local_418;
          }
          else {
            std::istream::read((char *)piVar21,(long)&this->m_waveformat);
            WVar2 = (this->m_waveformat).wFormatTag;
            if (WVar2 == 0x50) {
              std::istream::seekg((long)piVar21,0xffffffec);
              std::istream::read((char *)piVar21,(long)&this->m_waveformatMpeg12);
              std::istream::seekg((long)piVar21,size - 0x2c);
              this_00 = local_410;
              local_400 = (ulong)(this->m_waveformat).wBitsPerSample;
              local_408 = (int *)(ulong)(this->m_waveformat).nBlockAlign;
              local_3f8 = (ulong)(this->m_waveformatMpeg12).dwHeadBitrate;
              local_3a0 = (ulong)(this->m_waveformatMpeg12).dwPTSHigh;
              snprintf(message,0x200,
                       "MPEG1WAVEFORMAT (\n  wFormatTag=0x%04x,\n  nChannels=%i,\n  nAvgBytesPerSec=%i,\n  nSamplesPerSec=%i,\n  wBitsPerSample=%i,\n  nBlockAlign=%i,\n  dwHeadBitrate=%i,\n  dwPTSHigh=%i,\n  dwPTSLow=%i,\n  fwHeadFlags=%i,\n  fwHeadLayer=%i,\n  fwHeadMode=%i,\n  fwHeadModeExt=%i,\n  wHeadEmphasis%i\n)"
                       ,(ulong)(this->m_waveformat).wFormatTag,(ulong)(this->m_waveformat).nChannels
                       ,(ulong)(this->m_waveformat).nAvgBytesPerSec,
                       (ulong)(this->m_waveformat).nSamplesPerSec,local_400,local_408,local_3f8,
                       local_3a0,(ulong)(this->m_waveformatMpeg12).dwPTSLow,
                       (ulong)(this->m_waveformatMpeg12).fwHeadFlags,
                       (ulong)(this->m_waveformatMpeg12).fwHeadLayer,
                       (ulong)(this->m_waveformatMpeg12).fwHeadMode,
                       (ulong)(this->m_waveformatMpeg12).fwHeadModeExt,
                       (ulong)(this->m_waveformatMpeg12).wHeadEmphasis);
            }
            else if (WVar2 == 0x55) {
              std::istream::seekg((long)piVar21,0xffffffec);
              std::istream::read((char *)piVar21,(long)&this->m_waveformatMP3);
              std::istream::seekg((long)piVar21,size - 0x24);
              this_00 = local_410;
              local_400 = (ulong)(this->m_waveformat).wBitsPerSample;
              snprintf(message,0x200,
                       "MPEGLAYER3WAVEFORMAT (\n  wFormatTag=0x%04x,\n  nChannels=%i,\n  nAvgBytesPerSec=%i,\n  nSamplesPerSec=%i,\n  wBitsPerSample=%i,\n  nBlockAlign=%i\n  fdwFlags%i,\n  nBlockSize%i,\n  nCodecDelay%i,\n  nFramesPerBlock%i,\n  wID=%i\n)"
                       ,(ulong)(this->m_waveformat).wFormatTag,(ulong)(this->m_waveformat).nChannels
                       ,(ulong)(this->m_waveformat).nAvgBytesPerSec,
                       (ulong)(this->m_waveformat).nSamplesPerSec,local_400,
                       (ulong)(this->m_waveformat).nBlockAlign,
                       (ulong)(this->m_waveformatMP3).fdwFlags,
                       (ulong)(this->m_waveformatMP3).nBlockSize,
                       (ulong)(this->m_waveformatMP3).nCodecDelay,
                       (ulong)(this->m_waveformatMP3).nFramesPerBlock,
                       (ulong)(this->m_waveformatMP3).wID);
            }
            else if (WVar2 == 0xfffe) {
              std::istream::seekg((long)piVar21,0xffffffec);
              std::istream::read((char *)piVar21,(long)&this->m_waveformatExt);
              std::istream::seekg((long)piVar21,size - 0x2c);
              this_00 = local_410;
              snprintf(message,0x200,
                       "WAVEFORMATEXTENSIBLE (\n  wFormatTag=0x%04x,\n  nChannels=%i,\n  nAvgBytesPerSec=%i,\n  nSamplesPerSec=%i,\n  wBitsPerSample=%i,\n  nBlockAlign=%i,\n  SubFormat=...,\n  wSamplesPerBlock=%i,\n  dwChannelMask=%i\n)"
                       ,(ulong)(this->m_waveformat).wFormatTag,(ulong)(this->m_waveformat).nChannels
                       ,(ulong)(this->m_waveformat).nAvgBytesPerSec,
                       (ulong)(this->m_waveformat).nSamplesPerSec,
                       (ulong)(this->m_waveformat).wBitsPerSample,
                       (ulong)(this->m_waveformat).nBlockAlign,
                       (ulong)(this->m_waveformatExt).Samples.wValidBitsPerSample,
                       (ulong)(this->m_waveformatExt).dwChannelMask);
            }
            else {
              std::istream::seekg((long)piVar21,size - 0x14);
              snprintf(message,0x200,
                       "WAVEFORMATEX (\n  wFormatTag=0x%04x,\n  nChannels=%i,\n  nAvgBytesPerSec=%i,\n  nSamplesPerSec=%i,\n  wBitsPerSample=%i,\n  nBlockAlign=%i\n)"
                       ,(ulong)(this->m_waveformat).wFormatTag,(ulong)(this->m_waveformat).nChannels
                       ,(ulong)(this->m_waveformat).nAvgBytesPerSec,
                       (ulong)(this->m_waveformat).nSamplesPerSec,
                       (ulong)(this->m_waveformat).wBitsPerSample,
                       (ulong)(this->m_waveformat).nBlockAlign);
            }
            dVar5 = (double)std::__cxx11::string::string
                                      ((string *)&vprop_header,message,(allocator *)&super_index);
            LoggingObject::log(this_00,dVar5);
            piVar21 = local_418;
            uVar9 = std::__cxx11::string::~string((string *)&vprop_header);
            local_400 = CONCAT44(local_400._4_4_,(int)CONCAT71((int7)((ulong)uVar9 >> 8),1));
          }
        }
        else if (tag._0_4_ == 0x68697661) {
          std::istream::read((char *)piVar21,(long)&size);
          if (size != 0x38) {
            return 0;
          }
          (this->m_avimHeader).fcc = (FOURCC)tag._0_4_;
          (this->m_avimHeader).cb = 0x38;
          std::istream::read((char *)piVar21,(long)&(this->m_avimHeader).dwMicroSecPerFrame);
          snprintf(message,0x200,
                   "AVIMAINHEADER (\n  dwFlags=0x%x,\n  dwWidth=%i,\n  dwHeight=%i,\n  dwStreams=%i,\n  dwInitialFrames=%i,\n  dwMaxBytesPerSec=%i\n  dwMicroSecPerFrame=%i\n  dwPaddingGranularity=%i\n  dwSuggestedBufferSize=%i\n  dwTotalFrames=%i\n)"
                   ,(ulong)(this->m_avimHeader).dwFlags,(ulong)(this->m_avimHeader).dwWidth,
                   (ulong)(this->m_avimHeader).dwHeight,(ulong)(this->m_avimHeader).dwStreams,
                   (ulong)(this->m_avimHeader).dwInitialFrames,
                   (ulong)(this->m_avimHeader).dwMaxBytesPerSec,
                   (ulong)(this->m_avimHeader).dwMicroSecPerFrame,
                   (ulong)(this->m_avimHeader).dwPaddingGranularity,
                   (ulong)(this->m_avimHeader).dwSuggestedBufferSize,
                   (ulong)(this->m_avimHeader).dwTotalFrames);
          dVar5 = (double)std::__cxx11::string::string
                                    ((string *)&vprop_header,message,(allocator *)&super_index);
          this_00 = local_410;
          LoggingObject::log(local_410,dVar5);
          std::__cxx11::string::~string((string *)&vprop_header);
          piVar21 = local_418;
        }
        else if (tag._0_4_ == 0x686c6d64) {
          std::istream::read((char *)piVar21,(long)&size);
          std::istream::read((char *)piVar21,(long)&this->m_odmlExt);
          std::istream::seekg((long)piVar21,size - 4);
          snprintf(message,0x200,"ODMLExtendedAVIHeader ( dwTotalFrames=%i )",
                   (ulong)(this->m_odmlExt).dwTotalFrames);
          dVar5 = (double)std::__cxx11::string::string
                                    ((string *)&vprop_header,message,(allocator *)&super_index);
          LoggingObject::log(this_00,dVar5);
          std::__cxx11::string::~string((string *)&vprop_header);
        }
        else if (tag._0_4_ != 0x68727473) {
          if (tag._0_4_ == 0x69766f6d) {
            lVar11 = std::istream::tellg();
            vprop_header._0_8_ = lVar11 + -4;
            std::deque<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                      (&this->m_moviOffs,(unsigned_long *)&vprop_header);
LAB_0013179a:
            _Var23 = size - 4;
          }
          else {
            if (tag._0_4_ != 0x6c686d64) {
              if ((tag._0_4_ == 0x6c6d646f) || (tag._0_4_ == 0x6c726468)) goto LAB_00131454;
              if (tag._0_4_ == 0x6c727473) {
                if (1 < (int)local_3f0) {
                  return 0;
                }
                uVar18 = (ulong)local_3f0;
                pAVar1 = this->m_avisHeader + uVar18;
                std::istream::read((char *)piVar21,(long)pAVar1);
                uVar3 = this->m_avisHeader[uVar18].fccType._;
                local_400 = CONCAT44(local_400._4_4_,
                                     (int)CONCAT71((int7)((ulong)pcVar17 >> 8),uVar3 == 0x73647561))
                ;
                if (uVar3 != 0x73647561) {
                  this->m_videoStreamIdx = uVar20;
                }
                uVar18 = (ulong)(uint)(int)(char)uVar3;
                if ((char)uVar3 == '\0') {
                  uVar18 = 0x3f;
                }
                uVar24 = (ulong)(uint)(int)(char)(uVar3 >> 8);
                if ((uVar3 & 0xff00) == 0) {
                  uVar24 = 0x3f;
                }
                uVar25 = (ulong)(uint)(int)(char)(uVar3 >> 0x10);
                if ((uVar3 & 0xff0000) == 0) {
                  uVar25 = 0x3f;
                }
                uVar26 = (ulong)(uint)((int)uVar3 >> 0x18);
                if (uVar3 < 0x1000000) {
                  uVar26 = 0x3f;
                }
                local_408 = (int *)(ulong)pAVar1->dwFlags;
                cVar6 = (char)(pAVar1->fccHandler)._;
                if (cVar6 == '\0') {
                  cVar6 = '?';
                }
                cVar7 = (pAVar1->fccHandler).fcc[1];
                if (cVar7 == '\0') {
                  cVar7 = '?';
                }
                local_3f8 = (ulong)(uint)(int)cVar7;
                cVar7 = (pAVar1->fccHandler).fcc[2];
                if (cVar7 == '\0') {
                  cVar7 = '?';
                }
                cVar19 = (pAVar1->fccHandler).fcc[3];
                if (cVar19 == '\0') {
                  cVar19 = '?';
                }
                local_3a0 = (ulong)(uint)(int)cVar7;
                snprintf(message,0x200,
                         "AVISTREAMHEADER (\n  fccType=%c%c%c%c,\n  fccHandler=%c%c%c%c,\n  dwFlags=%i,\n  wPriority=%i,\n  wLanguage=%i,\n  dwInitialFrames=%i\n  dwScale=%i\n  dwRate=%i\n  dwStart=%i\n  dwLength=%i\n  dwSuggestedBufferSize=%i\n  dwQuality=%i\n  dwSampleSize=%i\n  rcFrame.left=%i\n  rcFrame.top=%i\n  rcFrame.right=%i\n  rcFrame.bottom=%i\n)"
                         ,uVar18,uVar24,uVar25,uVar26,(ulong)(uint)(int)cVar6,local_3f8,local_3a0,
                         (ulong)(uint)(int)cVar19,local_408,(ulong)pAVar1->wPriority,
                         (ulong)pAVar1->wLanguage,(ulong)pAVar1->dwInitialFrames,
                         (ulong)pAVar1->dwScale,(ulong)pAVar1->dwRate,(ulong)pAVar1->dwStart,
                         (ulong)pAVar1->dwLength,(ulong)pAVar1->dwSuggestedBufferSize,
                         (ulong)pAVar1->dwQuality,(ulong)pAVar1->dwSampleSize,
                         (ulong)(uint)(int)(pAVar1->rcFrame).left,
                         (ulong)(uint)(int)(pAVar1->rcFrame).top,
                         (ulong)(uint)(int)(pAVar1->rcFrame).right,
                         (ulong)(uint)(int)(pAVar1->rcFrame).bottom);
                dVar5 = (double)std::__cxx11::string::string
                                          ((string *)&vprop_header,message,(allocator *)&super_index
                                          );
                this_00 = local_410;
                LoggingObject::log(local_410,dVar5);
                piVar21 = local_418;
                std::__cxx11::string::~string((string *)&vprop_header);
                local_3f0 = local_3f0 + 1;
                goto LAB_00131454;
              }
              if (tag._0_4_ == 0x6e727473) {
                std::istream::read((char *)piVar21,(long)&size);
                goto LAB_0013179a;
              }
              if (tag._0_4_ == 0x70727076) {
                std::istream::read((char *)piVar21,(long)&size);
                std::istream::read((char *)piVar21,(long)&vprop_header);
                pvVar12 = malloc((ulong)vprop_header.nbFieldPerFrame << 5);
                piVar21 = local_418;
                std::istream::read((char *)local_418,(long)pvVar12);
                free(pvVar12);
                goto LAB_00131454;
              }
              if (tag._0_4_ == 0x74616454) goto LAB_00131454;
            }
LAB_00131d66:
            std::istream::read((char *)piVar21,(long)&size);
            _Var23 = size;
          }
          std::istream::seekg((long)piVar21,_Var23);
        }
      }
      goto LAB_00131454;
    }
  }
  std::istream::read((char *)piVar21,(long)&size);
  goto LAB_00131454;
}

Assistant:

bool avilib::AviReader::open( const char *filename )
{
	char tag[ 5 ] = {0};
	uint32_t size = 0;
	bool b_audio = false;
	int32_t i_streamHeader = 0;
	m_useMovieOffset = false;
	char message[512];
	clear_log();

	m_moviOffs.clear();
	_f.open( filename, ifstream::binary );
	if( !_f.good() ){
		log( "Cannot parse, file is bad." );
		return false;
	}

	_f.seekg(0,ifstream::beg);
	for(;_f.good();)
	{
		int64_t pos = _f.tellg();
		if( !_f.read( tag, 4 ) ) break;

		snprintf( message, 512, "%s @ " LLU, tag, (uint64_t)pos );
		log( message );

		if( *(uint32_t *)tag == (uint32_t)'KNUJ' ){
			_f.read( (char *)&size, 4 );
			_f.seekg(size,ifstream::cur);
		}
		else if( *(uint32_t *)tag == (uint32_t)'FFIR' ){
			_f.read( (char *)&size, 4 );  // file size
		}
		else if( *(uint32_t *)tag == (uint32_t)' IVA' ){
			continue;
		}
		else if( *(uint32_t *)tag == (uint32_t)'XIVA' ){
			continue; // OPENDML: AVIX, further RIFF chunk(s)
		}
		else if( *(uint32_t *)tag == (uint32_t)'TSIL' ){
			_f.read( (char *)&size, 4 );  // 1st: file size
		}
		else if( *(uint32_t *)tag == (uint32_t)'lrdh' ){
			continue;
		}
		else if( *(uint32_t *)tag == (uint32_t)'hiva' ){
			_f.read( (char *)&size, 4 );  // AVIMAINHEADER
			if( size != sizeof( avilib::AVIMAINHEADER ) - 8 )
				return false;
			m_avimHeader.fcc = *(FOURCC*)tag;
			m_avimHeader.cb = size;
			_f.read( (char *)&m_avimHeader + 8, m_avimHeader.cb );
			snprintf( message, 512, "AVIMAINHEADER (\n  dwFlags=0x%x,\n  dwWidth=%i,\n  dwHeight=%i,\n  dwStreams=%i,\n  dwInitialFrames=%i,\n  dwMaxBytesPerSec=%i\n  dwMicroSecPerFrame=%i\n  dwPaddingGranularity=%i\n  dwSuggestedBufferSize=%i\n  dwTotalFrames=%i\n)",
					m_avimHeader.dwFlags, m_avimHeader.dwWidth, m_avimHeader.dwHeight, m_avimHeader.dwStreams, m_avimHeader.dwInitialFrames, m_avimHeader.dwMaxBytesPerSec, m_avimHeader.dwMicroSecPerFrame, m_avimHeader.dwPaddingGranularity, m_avimHeader.dwSuggestedBufferSize, m_avimHeader.dwTotalFrames );
			log( message );
		}
		else if( *(uint32_t *)tag == (uint32_t)'lrts' ){
			if( i_streamHeader >= 2 ) return false;
			_f.read( (char *)&m_avisHeader[i_streamHeader], sizeof(avilib::AVISTREAMHEADER) );
			b_audio = m_avisHeader[i_streamHeader].fccType._ == (uint32_t)'sdua';
			if( !b_audio )
				m_videoStreamIdx = i_streamHeader;

			snprintf( message, 512, "AVISTREAMHEADER (\n  fccType=%c%c%c%c,\n  fccHandler=%c%c%c%c,\n  dwFlags=%i,\n  wPriority=%i,\n  wLanguage=%i,\n  dwInitialFrames=%i\n  dwScale=%i\n  dwRate=%i\n  dwStart=%i\n  dwLength=%i\n  dwSuggestedBufferSize=%i\n  dwQuality=%i\n  dwSampleSize=%i\n  rcFrame.left=%i\n  rcFrame.top=%i\n  rcFrame.right=%i\n  rcFrame.bottom=%i\n)",
					m_avisHeader[i_streamHeader].fccType.fcc[0] ? m_avisHeader[i_streamHeader].fccType.fcc[0] : '?',
					m_avisHeader[i_streamHeader].fccType.fcc[1] ? m_avisHeader[i_streamHeader].fccType.fcc[1] : '?',
					m_avisHeader[i_streamHeader].fccType.fcc[2] ? m_avisHeader[i_streamHeader].fccType.fcc[2] : '?',
					m_avisHeader[i_streamHeader].fccType.fcc[3] ? m_avisHeader[i_streamHeader].fccType.fcc[3] : '?',
					m_avisHeader[i_streamHeader].fccHandler.fcc[0] ? m_avisHeader[i_streamHeader].fccHandler.fcc[0] : '?',
					m_avisHeader[i_streamHeader].fccHandler.fcc[1] ? m_avisHeader[i_streamHeader].fccHandler.fcc[1] : '?',
					m_avisHeader[i_streamHeader].fccHandler.fcc[2] ? m_avisHeader[i_streamHeader].fccHandler.fcc[2] : '?',
					m_avisHeader[i_streamHeader].fccHandler.fcc[3] ? m_avisHeader[i_streamHeader].fccHandler.fcc[3] : '?',
					m_avisHeader[i_streamHeader].dwFlags,
					m_avisHeader[i_streamHeader].wPriority,
					m_avisHeader[i_streamHeader].wLanguage,
					m_avisHeader[i_streamHeader].dwInitialFrames,
					m_avisHeader[i_streamHeader].dwScale,
					m_avisHeader[i_streamHeader].dwRate,
					m_avisHeader[i_streamHeader].dwStart,
					m_avisHeader[i_streamHeader].dwLength,
					m_avisHeader[i_streamHeader].dwSuggestedBufferSize,
					m_avisHeader[i_streamHeader].dwQuality,
					m_avisHeader[i_streamHeader].dwSampleSize,
					m_avisHeader[i_streamHeader].rcFrame.left,
					m_avisHeader[i_streamHeader].rcFrame.top,
					m_avisHeader[i_streamHeader].rcFrame.right,
					m_avisHeader[i_streamHeader].rcFrame.bottom
					);
			log( message );
			i_streamHeader++;
		}
		else if( *(uint32_t *)tag == (uint32_t)'hrts' ){
			// int z=0;
		}
		else if( *(uint32_t *)tag == (uint32_t)'frts' ){
			_f.read( (char *)&size, 4 );
			if( b_audio ){
				_f.read( (char *)&m_waveformat, std::min( size, (uint32_t)sizeof(avilib::WAVEFORMATEX) ) );
				if( m_waveformat.wFormatTag == WAVE_FORMAT_EXTENSIBLE ){
					_f.seekg(-(std::streamoff)sizeof(avilib::WAVEFORMATEX),ifstream::cur);
					_f.read( (char *)&m_waveformatExt, (uint32_t)sizeof(avilib::WAVEFORMATEXTENSIBLE) );
					_f.seekg(size-sizeof(avilib::WAVEFORMATEXTENSIBLE),ifstream::cur);
					snprintf( message, 512, "WAVEFORMATEXTENSIBLE (\n  wFormatTag=0x%04x,\n  nChannels=%i,\n  nAvgBytesPerSec=%i,\n  nSamplesPerSec=%i,\n  wBitsPerSample=%i,\n  nBlockAlign=%i,\n  SubFormat=...,\n  wSamplesPerBlock=%i,\n  dwChannelMask=%i\n)",
							m_waveformat.wFormatTag, m_waveformat.nChannels, m_waveformat.nAvgBytesPerSec,
							m_waveformat.nSamplesPerSec, m_waveformat.wBitsPerSample, m_waveformat.nBlockAlign,
							m_waveformatExt.Samples.wSamplesPerBlock, m_waveformatExt.dwChannelMask);
				} else if( m_waveformat.wFormatTag == WAVE_FORMAT_MPEG ){
					_f.seekg(-(std::streamoff)sizeof(avilib::WAVEFORMATEX),ifstream::cur);
					_f.read( (char *)&m_waveformatMpeg12, (uint32_t)sizeof(avilib::MPEG1WAVEFORMAT) );
					_f.seekg((std::streamoff)size-sizeof(avilib::MPEG1WAVEFORMAT),ifstream::cur);
					snprintf( message, 512, "MPEG1WAVEFORMAT (\n  wFormatTag=0x%04x,\n  nChannels=%i,\n  nAvgBytesPerSec=%i,\n  nSamplesPerSec=%i,\n  wBitsPerSample=%i,\n  nBlockAlign=%i,\n  dwHeadBitrate=%i,\n  dwPTSHigh=%i,\n  dwPTSLow=%i,\n  fwHeadFlags=%i,\n  fwHeadLayer=%i,\n  fwHeadMode=%i,\n  fwHeadModeExt=%i,\n  wHeadEmphasis%i\n)",
							m_waveformat.wFormatTag, m_waveformat.nChannels, m_waveformat.nAvgBytesPerSec,
							m_waveformat.nSamplesPerSec, m_waveformat.wBitsPerSample, m_waveformat.nBlockAlign,
							m_waveformatMpeg12.dwHeadBitrate, m_waveformatMpeg12.dwPTSHigh, m_waveformatMpeg12.dwPTSLow,
							m_waveformatMpeg12.fwHeadFlags, m_waveformatMpeg12.fwHeadLayer, m_waveformatMpeg12.fwHeadMode,
							m_waveformatMpeg12.fwHeadModeExt, m_waveformatMpeg12.wHeadEmphasis );
				} else if( m_waveformat.wFormatTag == WAVE_FORMAT_MPEGLAYER3 ){
					_f.seekg(-(std::streamoff)sizeof(avilib::WAVEFORMATEX),ifstream::cur);
					_f.read( (char *)&m_waveformatMP3, (uint32_t)sizeof(avilib::MPEGLAYER3WAVEFORMAT) );
					_f.seekg(size-sizeof(avilib::MPEGLAYER3WAVEFORMAT),ifstream::cur);
					snprintf( message, 512, "MPEGLAYER3WAVEFORMAT (\n  wFormatTag=0x%04x,\n  nChannels=%i,\n  nAvgBytesPerSec=%i,\n  nSamplesPerSec=%i,\n  wBitsPerSample=%i,\n  nBlockAlign=%i\n  fdwFlags%i,\n  nBlockSize%i,\n  nCodecDelay%i,\n  nFramesPerBlock%i,\n  wID=%i\n)",
							m_waveformat.wFormatTag, m_waveformat.nChannels, m_waveformat.nAvgBytesPerSec,
							m_waveformat.nSamplesPerSec, m_waveformat.wBitsPerSample, m_waveformat.nBlockAlign,
							m_waveformatMP3.fdwFlags, m_waveformatMP3.nBlockSize, m_waveformatMP3.nCodecDelay, m_waveformatMP3.nFramesPerBlock,
							m_waveformatMP3.wID);
				} else {
					_f.seekg(size-sizeof(avilib::WAVEFORMATEX),ifstream::cur);
					snprintf( message, 512, "WAVEFORMATEX (\n  wFormatTag=0x%04x,\n  nChannels=%i,\n  nAvgBytesPerSec=%i,\n  nSamplesPerSec=%i,\n  wBitsPerSample=%i,\n  nBlockAlign=%i\n)",
							m_waveformat.wFormatTag, m_waveformat.nChannels, m_waveformat.nAvgBytesPerSec,
							m_waveformat.nSamplesPerSec, m_waveformat.wBitsPerSample, m_waveformat.nBlockAlign );
				}
				log( message );
			} else {
				_f.read( (char *)&m_bitmapInfo, std::min( size, (uint32_t)sizeof(avilib::BITMAPINFO) ) );
				if( size>sizeof(avilib::BITMAPINFO) )
					_f.seekg(size-sizeof(avilib::BITMAPINFO),ifstream::cur);
				snprintf( message, 512, "BITMAPINFO (\n  biWidth=%i,\n  biHeight=%i,\n  biPlanes=%i,\n  biBitCount=%i,\n  biCompression=%s,\n  biSizeImage=%i,\n  biXPelsPerMeter=%i,\n  biYPelsPerMeter=%i,\n  biClrUsed=%i,\n  biClrImportant=%i,\n)",
						m_bitmapInfo.biWidth, m_bitmapInfo.biHeight, m_bitmapInfo.biPlanes,
						m_bitmapInfo.biBitCount, m_bitmapInfo.biCompression.fcc, m_bitmapInfo.biSizeImage,
						m_bitmapInfo.biXPelsPerMeter, m_bitmapInfo.biYPelsPerMeter,
						m_bitmapInfo.biClrUsed, m_bitmapInfo.biClrImportant);
				log( message );
			}
		}
		else if( *(uint32_t *)tag == (uint32_t)'OFNI' ){
			continue;
		}
		else if( *(uint32_t *)tag == (uint32_t)'TFSI' ){
			_f.read( (char *)&size, 4 );
			_f.seekg(size,ifstream::cur);
		}
		else if( *(uint32_t *)tag == (uint32_t)'nrts' ){
			_f.read( (char *)&size, 4 );
			_f.seekg(size-4,ifstream::cur);
		}
		else if( *(uint32_t *)tag == (uint32_t)'ivom' ){
			// the movie list, here is the data.
			m_moviOffs.push_back((size_t)_f.tellg() - 4);
			_f.seekg(size-4, ifstream::cur);
		}
		else if( *(uint32_t *)tag == (uint32_t)'1xdi' ){
			_f.read( (char *)&size, 4 );
			uint8_t *p = new uint8_t[size], *p0 = p;
			size = (uint32_t)_f.read((char *)p,size).gcount();
			for (size_t i=0; i<size/sizeof(AVIOLDINDEX); i++) {
				AVIOLDINDEX *idx = (AVIOLDINDEX *)p;
				p += sizeof(AVIOLDINDEX);
				
				if( idx->dwChunkId._ == ' cer' )
					continue;

				DMLINDEX dml_index;
				dml_index.dwChunkId = idx->dwChunkId;
				dml_index.u32_flags = idx->dwFlags;
				dml_index.i64_offset = idx->dwOffset;
				dml_index.u32_size = idx->dwSize;
				string fcc = idx->dwChunkId.fcc;
				int32_t stream_idx = atoi(fcc.substr(0,2).c_str());
				m_frameIdxs[stream_idx].push_back(dml_index);
/*
				switch(m_videoStreamIdx){
				case 0:
					if( idx->dwChunkId._ == (uint32_t)'cd00' || idx->dwChunkId._ == (uint32_t)'bd00' )//'bw10' )
						m_frameIdxs[stream_idx].push_back(dml_index);
					break;
				case 1:
					if( idx->dwChunkId._ == (uint32_t)'cd10' || idx->dwChunkId._ == (uint32_t)'bd10' )//'bw10' )
						m_frameIdxs[stream_idx].push_back(dml_index);
					break;
				}
 */
			}
			snprintf( message, 512, "%x AVIOLDINDEX", size/( uint32_t )sizeof(AVIOLDINDEX));
			log( message );
			delete [] p0;
		}
		else if( *(uint32_t *)tag == (uint32_t)'lmdo' ){
			continue;
		}
		else if( *(uint32_t *)tag == (uint32_t)'hlmd' ){
			_f.read( (char *)&size, 4 );
			_f.read((char *)&m_odmlExt, sizeof(avilib::ODMLExtendedAVIHeader));
			_f.seekg(size - sizeof(avilib::ODMLExtendedAVIHeader),ifstream::cur);
			snprintf( message, 512, "ODMLExtendedAVIHeader ( dwTotalFrames=%i )", m_odmlExt.dwTotalFrames); log( message );
		}
		else if( *(uint32_t *)tag == (uint32_t)'lhmd' ){
			_f.read( (char *)&size, 4 );
			_f.seekg(size,ifstream::cur);
		}
		else if( *(uint32_t *)tag == (uint32_t)'xdni' ){
			_f.read( (char *)&size, 4 );  // AVISUPERINDEX
			streampos superindex_end = _f.tellg() + (streampos)size;

			avilib::AVISUPERINDEX super_index;
			super_index.fcc._ = *((uint32_t *)&tag);
			super_index.cb = size;
			_f.read( (char *)&super_index + 8, sizeof(avilib::AVISUPERINDEX)-8 );

			string fcc = super_index.dwChunkId.fcc;
			int32_t stream_idx = atoi(fcc.substr(0,2).c_str());

			assert( 0 == super_index.bIndexSubType );
			if( 0 != super_index.bIndexSubType ) log( "Warning: 0 != super_index.bIndexSubType" );
			if( AVI_INDEX_OF_INDEXES != super_index.bIndexType ) log( "Warning: AVI_INDEX_OF_INDEXES != super_index.bIndexType" );
			deque<avilib::AVISUPERINDEX_ENTRY> entries;

			for( uint32_t i=0; i<super_index.nEntriesInUse; i++ )
			{
				avilib::AVISUPERINDEX_ENTRY entry;
				_f.read( (char *)&entry, sizeof(avilib::AVISUPERINDEX_ENTRY) );
				entries.push_back(entry);
			}

			snprintf( message, 512, "%ux AVISUPERINDEX_ENTRY (%s)", super_index.nEntriesInUse, fcc.c_str()); log( message );

			for( avilib::AVISUPERINDEX_ENTRY &entry : entries ){
				_f.seekg( entry.qwOffset, ifstream::beg );
				avilib::AVISTDINDEX std_index;
				memset( &std_index, 0x0, sizeof(avilib::AVISTDINDEX));
				_f.read( (char *)&std_index, sizeof(avilib::AVISTDINDEX) );

				if( std_index.dwChunkId._ == ' cer' )
					continue;

				std::array<uint32_t,6> allowed = {
					(uint32_t)'cd00', (uint32_t)'bd00', (uint32_t)'cd10', (uint32_t)'bd10',
					(uint32_t)'bw00', (uint32_t)'bw10' };

				if( std::find( allowed.begin(),allowed.end(), std_index.dwChunkId._ ) != allowed.end() ){

					// not for audio:
					if( AVI_INDEX_OF_CHUNKS != std_index.bIndexType ) log( "Warning: AVI_INDEX_OF_CHUNKS != std_index.bIndexType" );
					if( 0 != std_index.bIndexSubType ) log( "Warning: 0 != std_index.bIndexSubType" );

					//if( std_index.fcc._ == (uint32_t)'00xi' )
					{
						uint8_t *p = new uint8_t[std_index.cb], *p0 = p;
						_f.read( (char *)p, std_index.cb );
						for( uint32_t j=0; j<std_index.nEntriesInUse; j++ )
						{
							avilib::AVISTDINDEX_ENTRY *idx = (avilib::AVISTDINDEX_ENTRY *)p;
							p += sizeof(avilib::AVISTDINDEX_ENTRY);
						
							DMLINDEX dml_index;
							dml_index.dwChunkId = std_index.dwChunkId;
							dml_index.u32_flags = 0;
							dml_index.i64_offset = std_index.qwBaseOffset + idx->dwOffset;// + 4;
							dml_index.u32_size = idx->dwSize & 0x7FFFFFFF;
							if(dml_index.u32_size > m_bitmapInfo.biSizeImage){
								// int z=0;
							}

							odml_frameIdxs[stream_idx].push_back(dml_index);
						}
						delete [] p0;
					}
				}
				_f.clear();
			} // each superindex entry
			m_superIndex[stream_idx] = super_index;
			_f.clear();
			_f.seekg(superindex_end,ifstream::beg);
		}
		else if( *(uint32_t *)tag == (uint32_t)'prpv' ){
			// this does nothing and has never been tested.
			_f.read( (char *)&size, 4 );
			VIDEO_PROP_HEADER vprop_header;
			_f.read( (char *)&vprop_header, std::min((size_t)size,sizeof(VIDEO_PROP_HEADER)) );
			VIDEO_PROP_HEADER::VIDEO_FIELD_DESC *p_field_desc = (VIDEO_PROP_HEADER::VIDEO_FIELD_DESC *)malloc(sizeof(VIDEO_PROP_HEADER::VIDEO_FIELD_DESC)*vprop_header.nbFieldPerFrame);
			_f.read((char *)p_field_desc, vprop_header.nbFieldPerFrame*sizeof(VIDEO_PROP_HEADER::VIDEO_FIELD_DESC));
			free( p_field_desc );
		}
		else if( *(uint32_t *)tag == ( uint32_t )'tadT'/* Adobe Premiere Timecode */ ){
			continue;
		}
		else
		{
			_f.read( (char *)&size, 4 );
			_f.seekg(size,ifstream::cur);
			// FIXME: check size is smaller than current parent element's size
		}
	}

	if( !odml_frameIdxs.empty() ){
		m_frameIdxs.swap(odml_frameIdxs);
		log( "using OpenDML index" );
	}

	_f.clear();
	_f.seekg(0,ifstream::beg);

	if( m_moviOffs.empty() )
		return false;
	
	return true;
}